

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewScopeLayer.cpp
# Opt level: O3

NewScopeLayer * __thiscall NewScopeLayer::GetVariableLayer(NewScopeLayer *this,Symbol *symbol)

{
  iterator iVar1;
  runtime_error *this_00;
  long *plVar2;
  long *plVar3;
  NewScopeLayer *pNVar4;
  string local_80;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  do {
    pNVar4 = this;
    iVar1 = std::
            _Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(pNVar4->variables_)._M_h,symbol);
    if (iVar1.
        super__Node_iterator_base<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>,_true>.
        _M_cur != (__node_type *)0x0) break;
    this = pNVar4->parent_;
  } while (pNVar4->parent_->parent_ != (NewScopeLayer *)0x0);
  iVar1 = std::
          _Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(pNVar4->variables_)._M_h,symbol);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>,_true>.
      _M_cur != (__node_type *)0x0) {
    return pNVar4;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  Symbol::GetName_abi_cxx11_(&local_80,symbol);
  std::operator+(&local_40,"Variable ",&local_80);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_60 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_60 == plVar3) {
    local_50 = *plVar3;
    lStack_48 = plVar2[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar3;
  }
  local_58 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_60);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

NewScopeLayer* NewScopeLayer::GetVariableLayer(const Symbol& symbol) {
  NewScopeLayer* current = this;

  while (!current->HasVariable(symbol) &&
         current->parent_->parent_ != nullptr) {
    current = current->parent_;
  }

  if (current->HasVariable(symbol)) {
    return current;
  }

  throw std::runtime_error("Variable " + symbol.GetName() + " is not declared");
}